

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_Ticker(void)

{
  char *pcVar1;
  int iVar2;
  FString musicname;
  bool bVar3;
  
  iVar2 = bcnt + 1;
  bVar3 = bcnt == 0;
  bcnt = iVar2;
  if (bVar3) {
    pcVar1 = ((level.info)->InterMusic).Chars;
    musicname.Chars = gameinfo.intermissionMusic.Chars;
    iVar2 = gameinfo.intermissionOrder;
    if (*(int *)(pcVar1 + -0xc) != 0) {
      musicname.Chars = pcVar1;
      iVar2 = (level.info)->intermusicorder;
    }
    S_ChangeMusic(musicname.Chars,iVar2,true,false);
  }
  WI_checkForAccelerate();
  if (state == NoState) {
    WI_updateNoState();
    return;
  }
  if (state == ShowNextLoc) {
    WI_updateShowNextLoc();
    return;
  }
  if (state != StatCount) {
    return;
  }
  if (deathmatch.Value != 0) {
    WI_updateDeathmatchStats();
    return;
  }
  if (multiplayer != true) {
    WI_updateStats();
    return;
  }
  WI_updateNetgameStats();
  return;
}

Assistant:

void WI_Ticker(void)
{
	// counter for general background animation
	bcnt++;  
	
	if (bcnt == 1)
	{
		// intermission music - use the defaults if none specified
		if (level.info->InterMusic.IsNotEmpty()) 
			S_ChangeMusic(level.info->InterMusic, level.info->intermusicorder);
		else
			S_ChangeMusic (gameinfo.intermissionMusic.GetChars(), gameinfo.intermissionOrder); 

	}
	
	WI_checkForAccelerate();
	
	switch (state)
	{
    case StatCount:
		if (deathmatch) WI_updateDeathmatchStats();
		else if (multiplayer) WI_updateNetgameStats();
		else WI_updateStats();
		break;
		
    case ShowNextLoc:
		WI_updateShowNextLoc();
		break;
		
    case NoState:
		WI_updateNoState();
		break;

	case LeavingIntermission:
		// Hush, GCC.
		break;
	}
}